

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)50,_(unsigned_short)30>::Unpack
               (uint32_t **in,uint64_t *out)

{
  unpack_single_out<(unsigned_char)50,(unsigned_char)28>(in,out + 0x1e);
  out[0x1f] = (ulong)(*in)[1] << 0x12 | (ulong)(**in >> 0xe);
  return;
}

Assistant:

static void Unpack(const uint32_t *__restrict &in, uint64_t *__restrict out) {
		unpack_single_out<DELTA, (DELTA * OINDEX) % 32>(in, out + OINDEX);

		Unroller<DELTA, OINDEX + 1>::Unpack(in, out);
	}